

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::MinimumValueCase::iterate(MinimumValueCase *this)

{
  TestLog *log;
  bool bVar1;
  ContextType CVar2;
  int iVar3;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  GLenum target;
  allocator<char> local_99;
  CallLogWrapper gl;
  string local_80;
  ResultCollector result;
  
  CVar2.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(CVar2,(ApiType)(this->m_minimumVersion).m_bits);
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Test not supported in this context version.",
               "contextSupports(m_context.getRenderContext().getType(), m_minimumVersion)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIntegerStateQueryTests.cpp"
               ,0xcf);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar3),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector(&result,log,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  CVar2.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
  if (bVar1) {
    target = this->m_target;
    if (target == 0x90da) {
      iVar3 = 4;
      goto LAB_012b4503;
    }
    if (target == 0x92d0) {
      iVar3 = 1;
      goto LAB_012b4503;
    }
    if (target == 0x92d6) {
      iVar3 = 8;
      goto LAB_012b4503;
    }
  }
  else {
    target = this->m_target;
  }
  iVar3 = this->m_minValue;
LAB_012b4503:
  gl.m_enableLog = true;
  deqp::gls::StateQueryUtil::verifyStateIntegerMin(&result,&gl,target,iVar3,this->m_verifierType);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

MinimumValueCase::IterateResult MinimumValueCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, contextSupports(m_context.getRenderContext().getType(), m_minimumVersion), "Test not supported in this context version.");

	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	// \note: In GL ES 3.2, the following targets have different limits as in 3.1
	const int				value	= contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2))
									? (m_target == GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS	? MAX_FRAG_ATOMIC_COUNTER_BUFFERS_GLES32	// 1
									: m_target == GL_MAX_FRAGMENT_ATOMIC_COUNTERS			? MAX_FRAG_ATOMIC_COUNTERS_GLES32			// 8
									: m_target == GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS		? MAX_FRAG_SHADER_STORAGE_BLOCKS_GLES32		// 4
									: m_minValue)
									: m_minValue;

	gl.enableLogging(true);
	verifyStateIntegerMin(result, gl, m_target, value, m_verifierType);

	result.setTestContextResult(m_testCtx);
	return STOP;
}